

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::ErrorCheckAndLog
          (ErrorsTest *this,GLchar *function_name,GLenum expected_error,
          GLchar *when_shall_be_generated)

{
  int iVar1;
  GLenum GVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected_error) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    iVar3 = (int)(ostringstream *)&local_1a8;
    if (function_name == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(function_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,function_name,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," does not generate ",0x13);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = expected_error;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
    if (when_shall_be_generated == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(when_shall_be_generated);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,when_shall_be_generated,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"The error value of ",0x13);
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," was observed.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    do {
      iVar3 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    } while (iVar3 != 0);
  }
  return GVar2 == expected_error;
}

Assistant:

bool ErrorsTest::ErrorCheckAndLog(const glw::GLchar* function_name, const glw::GLenum expected_error,
								  const glw::GLchar* when_shall_be_generated)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Error value storage. */
	glw::GLenum error = GL_NO_ERROR;

	/* Error comparision. */
	if (expected_error != (error = gl.getError()))
	{
		/* Log. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << function_name << " does not generate "
											<< glu::getErrorStr(expected_error) << when_shall_be_generated
											<< "The error value of " << glu::getErrorStr(error) << " was observed."
											<< tcu::TestLog::EndMessage;

		/* Error cleanup. */
		while (gl.getError())
			;

		/* Check failed. */
		return false;
	}

	/* Error was equal to expected. */
	return true;
}